

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O3

void __thiscall HighsSparseVectorSum::add(HighsSparseVectorSum *this,HighsInt index,double value)

{
  pointer pHVar1;
  iterator __position;
  long lVar2;
  pointer pHVar3;
  double dVar4;
  double dVar5;
  int local_14;
  
  lVar2 = (long)index;
  pHVar3 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar1 = pHVar3 + lVar2;
  dVar4 = pHVar3[lVar2].hi;
  dVar5 = dVar4 + pHVar3[lVar2].lo;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = dVar4 + value;
    pHVar1->hi = dVar5;
    dVar4 = pHVar3[lVar2].lo + (dVar4 - (dVar5 - value)) + (value - (dVar5 - (dVar5 - value)));
    pHVar1->lo = dVar4;
    value = dVar5;
  }
  else {
    pHVar1->hi = value;
    pHVar1->lo = 0.0;
    __position._M_current =
         (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_14 = index;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->nonzeroinds,__position,&local_14);
      lVar2 = (long)local_14;
      pHVar3 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      value = pHVar3[lVar2].hi;
      dVar4 = pHVar3[lVar2].lo;
    }
    else {
      *__position._M_current = index;
      (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
      dVar4 = 0.0;
    }
  }
  if ((dVar4 + value == 0.0) && (!NAN(dVar4 + value))) {
    pHVar3[lVar2].hi = 2.2250738585072014e-308;
    pHVar3[lVar2].lo = 0.0;
  }
  return;
}

Assistant:

void add(HighsInt index, double value) {
    assert(index >= 0 && index < (HighsInt)values.size());
    if (values[index] != 0.0) {
      values[index] += value;
    } else {
      values[index] = value;
      nonzeroinds.push_back(index);
    }

    if (values[index] == 0.0)
      values[index] = std::numeric_limits<double>::min();
  }